

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> *
read_compressed_run(vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
                   uint8_t *start,uint8_t *end)

{
  int iVar1;
  byte bVar2;
  uint uVar3;
  uint8_t *ptr;
  uint local_2c;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = 0;
  uVar3 = 0xffffffff;
  iVar1 = 0;
  for (; start < end; start = start + 1) {
    iVar1 = ((*start & 0x7f) << (bVar2 & 0x1f)) + iVar1;
    if ((char)*start < '\0') {
      bVar2 = bVar2 + 7;
    }
    else {
      uVar3 = uVar3 + iVar1 + 1;
      local_2c = uVar3;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (__return_storage_ptr__,&local_2c);
      bVar2 = 0;
      iVar1 = 0;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<FileId> read_compressed_run(const uint8_t *start,
                                        const uint8_t *end) {
    std::vector<FileId> res;
    uint64_t acc = 0;
    uint32_t shift = 0;
    int64_t prev = -1;

    for (const uint8_t *ptr = start; ptr < end; ++ptr) {
        uint32_t next = *ptr;

        acc += (next & 0x7FU) << shift;
        shift += 7U;
        if ((next & 0x80U) == 0) {
            prev += acc + 1;
            res.push_back(prev);
            acc = 0;
            shift = 0;
        }
    }

    return res;
}